

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance_test.cc
# Opt level: O2

void __thiscall EditDistanceTestTestEmpty::Run(EditDistanceTestTestEmpty *this)

{
  Test *pTVar1;
  int iVar2;
  StringPiece local_50;
  StringPiece local_40;
  
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  local_50.str_ = "ninja";
  local_50.len_ = 5;
  iVar2 = EditDistance(&local_40,&local_50,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x14,"5 == EditDistance(\"\", \"ninja\")");
  pTVar1 = g_current_test;
  local_40.str_ = "ninja";
  local_40.len_ = 5;
  local_50.str_ = "";
  local_50.len_ = 0;
  iVar2 = EditDistance(&local_40,&local_50,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x15,"5 == EditDistance(\"ninja\", \"\")");
  pTVar1 = g_current_test;
  local_40.str_ = "";
  local_40.len_ = 0;
  local_50.str_ = "";
  local_50.len_ = 0;
  iVar2 = EditDistance(&local_40,&local_50,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x16,"0 == EditDistance(\"\", \"\")");
  return;
}

Assistant:

TEST(EditDistanceTest, TestEmpty) {
  EXPECT_EQ(5, EditDistance("", "ninja"));
  EXPECT_EQ(5, EditDistance("ninja", ""));
  EXPECT_EQ(0, EditDistance("", ""));
}